

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

void __thiscall
duckdb::IEJoinGlobalState::IEJoinGlobalState
          (IEJoinGlobalState *this,ClientContext *context,PhysicalIEJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
  *this_00;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_01;
  pointer pLVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  GlobalSortedTable *pGVar4;
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  *p_Var5;
  vector<duckdb::BoundOrderByNode,_true> rhs_order;
  vector<duckdb::BoundOrderByNode,_true> lhs_order;
  RowLayout rhs_layout;
  RowLayout lhs_layout;
  GlobalSortedTable *local_160;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_158;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_150;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_148;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_128;
  RowLayout local_110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  RowLayout local_88;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__IEJoinGlobalState_019c4bc8;
  this_00 = &this->tables;
  (this->tables).
  super_vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tables).
  super_vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tables).
  super_vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->child = 0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
  ::resize(&this_00->
            super_vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>_>_>
           ,2);
  RowLayout::RowLayout(&local_88);
  this_01 = &(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
             super_CachingPhysicalOperator.super_PhysicalOperator.children;
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,
             &(pvVar2->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&local_88,(vector<duckdb::LogicalType,_true> *)&local_a0,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  local_128.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->lhs_orders,0);
  BoundOrderByNode::Copy((BoundOrderByNode *)&local_110,pvVar3);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>(&local_128,(BoundOrderByNode *)&local_110);
  if ((BaseStatistics *)
      local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_110.types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    operator_delete(local_110.types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (**(code **)(*(long *)local_110.types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 8))();
  }
  pGVar4 = (GlobalSortedTable *)operator_new(0x2e0);
  PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
            (pGVar4,context,(vector<duckdb::BoundOrderByNode,_true> *)&local_128,&local_88,
             (PhysicalOperator *)op);
  local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pGVar4;
  p_Var5 = (__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
            *)vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
              ::operator[](this_00,0);
  pLVar1 = local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ::reset(p_Var5,(pointer)pLVar1);
  pLVar1 = local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((GlobalSortedTable *)
      local_110.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (GlobalSortedTable *)0x0) {
    PhysicalRangeJoin::GlobalSortedTable::~GlobalSortedTable
              ((GlobalSortedTable *)
               local_110.types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    operator_delete(pLVar1);
  }
  RowLayout::RowLayout(&local_110);
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,1);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_b8,
             &(pvVar2->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&local_110,(vector<duckdb::LogicalType,_true> *)&local_b8,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b8);
  local_148.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->rhs_orders,0);
  BoundOrderByNode::Copy((BoundOrderByNode *)&local_160,pvVar3);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>(&local_148,(BoundOrderByNode *)&local_160);
  if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_150._M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl != (BaseStatistics *)0x0)
  {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_150._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
    operator_delete((void *)local_150._M_t.
                            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
  }
  local_150._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
       (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0
  ;
  if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_158._M_head_impl !=
      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
    (*((local_158._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  pGVar4 = (GlobalSortedTable *)operator_new(0x2e0);
  PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
            (pGVar4,context,(vector<duckdb::BoundOrderByNode,_true> *)&local_148,&local_110,
             (PhysicalOperator *)op);
  local_160 = pGVar4;
  p_Var5 = (__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
            *)vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
              ::operator[](this_00,1);
  pGVar4 = local_160;
  local_160 = (GlobalSortedTable *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ::reset(p_Var5,pGVar4);
  pGVar4 = local_160;
  if (local_160 != (GlobalSortedTable *)0x0) {
    PhysicalRangeJoin::GlobalSortedTable::~GlobalSortedTable(local_160);
    operator_delete(pGVar4);
  }
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_148);
  if (local_110.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_110);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_128);
  if (local_88.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  return;
}

Assistant:

IEJoinGlobalState(ClientContext &context, const PhysicalIEJoin &op) : child(0) {
		tables.resize(2);
		RowLayout lhs_layout;
		lhs_layout.Initialize(op.children[0].get().GetTypes());
		vector<BoundOrderByNode> lhs_order;
		lhs_order.emplace_back(op.lhs_orders[0].Copy());
		tables[0] = make_uniq<GlobalSortedTable>(context, lhs_order, lhs_layout, op);

		RowLayout rhs_layout;
		rhs_layout.Initialize(op.children[1].get().GetTypes());
		vector<BoundOrderByNode> rhs_order;
		rhs_order.emplace_back(op.rhs_orders[0].Copy());
		tables[1] = make_uniq<GlobalSortedTable>(context, rhs_order, rhs_layout, op);
	}